

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O2

intptr_t __thiscall xemmai::t_tuple::f_hash(t_tuple *this)

{
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *paVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  t_value<xemmai::t_pointer> x;
  t_value<xemmai::t_slot> local_40;
  
  uVar3 = 0;
  for (uVar2 = 0; uVar2 < this->v_size; uVar2 = uVar2 + 1) {
    t_value<xemmai::t_slot>::f_hash(&local_40);
    f_check<long>((t_object *)local_40.super_t_slot.v_p._M_b._M_p,L"value");
    paVar1 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
             ((long)local_40.super_t_slot.v_p._M_b._M_p + 0x48);
    if ((ulong)local_40.super_t_slot.v_p._M_b._M_p < (t_object *)0x5) {
      paVar1 = &local_40.field_0;
    }
    uVar3 = uVar3 ^ paVar1->v_integer;
  }
  return uVar3;
}

Assistant:

intptr_t t_tuple::f_hash() const
{
	intptr_t n = 0;
	for (size_t i = 0; i < v_size; ++i) {
		auto x = (*this)[i].f_hash();
		f_check<intptr_t>(x, L"value");
		n ^= f_as<intptr_t>(x);
	}
	return n;
}